

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_utf8_exception.cpp
# Opt level: O0

char * __thiscall argo::json_utf8_exception::get_main_message(json_utf8_exception *this)

{
  json_utf8_exception *this_local;
  
  switch((this->super_json_exception).m_type) {
  case invalid_string_escape_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f63f;
    break;
  case invalid_string_encoding_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f655;
    break;
  case invalid_unicode_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f66b;
    break;
  case invalid_utf8_char_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f6b7;
    break;
  case invalid_utf8_sequence_length_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f681;
    break;
  case invalid_hex_char_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f697;
    break;
  case invalid_hex_number_e:
    this_local = (json_utf8_exception *)anon_var_dwarf_2f6a1;
    break;
  default:
    this_local = (json_utf8_exception *)anon_var_dwarf_1e9ae;
  }
  return (char *)this_local;
}

Assistant:

const char *json_utf8_exception::get_main_message()
{
    switch (m_type)
    {
    case invalid_string_escape_e:
        return "invalid escape character found in string";
    case invalid_string_encoding_e:
        return "string encoding is invalid";
    case invalid_unicode_e:
        return "invalid unicode value";
    case invalid_utf8_sequence_length_e:
        return "invalid UTF-8 sequence length";
    case invalid_hex_char_e:
        return "invalid hex character";
    case invalid_hex_number_e:
        return "invalid hex number (must be 0-15)";
    case invalid_utf8_char_e:
        return "0 byte detected in UTF-8 sequence other than code point 0";
    default:
        return "generic";
    }
}